

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

ON_RenderContent * __thiscall
ON_RenderContentPrivate::FindPrevSibling(ON_RenderContentPrivate *this,ON_RenderContent *child)

{
  ON_RenderContent *pOVar1;
  ON_RenderContent *pOVar2;
  
  pOVar1 = this->m_first_child;
  if (this->m_first_child != child) {
    do {
      pOVar2 = pOVar1;
      if (pOVar2 == (ON_RenderContent *)0x0) {
        return (ON_RenderContent *)0x0;
      }
      pOVar1 = pOVar2->_private->m_next_sibling;
    } while (pOVar1 != child);
    if (pOVar2 != (ON_RenderContent *)0x0) {
      return pOVar2;
    }
  }
  return (ON_RenderContent *)0x0;
}

Assistant:

ON_RenderContent* ON_RenderContentPrivate::FindPrevSibling(ON_RenderContent* child) const
{
  if (child != m_first_child)
  {
    ON_RenderContent* candidate = m_first_child;
    while (nullptr != candidate)
    {
      if (child == candidate->_private->m_next_sibling)
        return candidate;

      candidate = candidate->_private->m_next_sibling;
    }
  }

  return nullptr;
}